

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall Engine_testAddDoubleWithTags_Test::TestBody(Engine_testAddDoubleWithTags_Test *this)

{
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar1;
  long lVar2;
  char *pcVar3;
  AssertHelper local_148;
  AssertHelper local_140;
  AssertionResult gtest_ar_1;
  _Head_base<0UL,_Handler_*,_false> local_128;
  value_type dm;
  Engine e;
  Tag local_90;
  Tag local_50;
  
  std::make_unique<TestHandler>();
  local_128._M_head_impl = (Handler *)dm.time;
  dm.time.__d.__r = (duration)0;
  Engine::Engine(&e,"test",(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_128);
  if (local_128._M_head_impl != (Handler *)0x0) {
    (*(local_128._M_head_impl)->_vptr_Handler[3])();
  }
  local_128._M_head_impl = (Handler *)0x0;
  if (dm.time.__d.__r != 0) {
    (**(code **)(*(long *)dm.time.__d.__r + 0x18))();
  }
  std::__cxx11::string::string((string *)&dm,"foo",(allocator *)&local_148);
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_7_ = 0x40250000000000;
  Tag::Tag(&local_50,"Hello","World");
  Tag::Tag(&local_90,"Another","Tag");
  Engine::Add<double,_nullptr,_Tag,_Tag>(&e,(string *)&dm,(double *)&gtest_ar_1,&local_50,&local_90)
  ;
  Tag::~Tag(&local_90);
  Tag::~Tag(&local_50);
  std::__cxx11::string::~string((string *)&dm);
  pvVar1 = Engine::GetHandlers(&e);
  lVar2 = __dynamic_cast((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
                         (((pvVar1->
                           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t,
                         &Handler::typeinfo,&TestHandler::typeinfo,0);
  local_148.data_._0_4_ = 1;
  gtest_ar_1._0_8_ = (*(long *)(lVar2 + 0x28) - *(long *)(lVar2 + 0x20)) / 0x58;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&dm,"1","th->doubleMeasures.size()",(int *)&local_148,
             (unsigned_long *)&gtest_ar_1);
  if ((char)dm.time.__d.__r == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (dm.name._M_dataplus._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)dm.name._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0xa7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&dm.name);
    goto LAB_00115be5;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&dm.name);
  Measure<double>::Measure(&dm,*(Measure<double> **)(lVar2 + 0x20));
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"test.foo\"","dm.name",(char (*) [9])"test.foo",&dm.name);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_148);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0xa9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
LAB_00115bbc:
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_148);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_148.data_ = local_148.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<MetricTypes::MetricType,MetricTypes::MetricType>
              ((internal *)&gtest_ar_1,"MetricType::Counter","dm.type",(MetricType *)&local_148,
               &dm.type);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0xaa,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      goto LAB_00115bbc;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_148.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,float>
              ((internal *)&gtest_ar_1,"1","dm.rate",(int *)&local_148,&dm.rate);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0xab,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      goto LAB_00115bbc;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_148.data_ = (AssertHelperData *)0x4025000000000000;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_1,"10.5","dm.value",(double *)&local_148,&dm.value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0xac,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      goto LAB_00115bbc;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_140.data_._0_4_ = 2;
    local_148.data_ =
         (AssertHelperData *)
         ((long)dm.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dm.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start >> 6);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar_1,"2","dm.tags.size()",(int *)&local_140,
               (unsigned_long *)&local_148);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0xad,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      goto LAB_00115bbc;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Hello\"","dm.tags[0].name",(char (*) [6])"Hello",
               &(dm.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)->name);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0xae,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      goto LAB_00115bbc;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"World\"","dm.tags[0].value",(char (*) [6])"World",
               &(dm.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)->value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0xaf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      goto LAB_00115bbc;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Another\"","dm.tags[1].name",(char (*) [8])"Another",
               &dm.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start[1].name);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0xb0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      goto LAB_00115bbc;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Tag\"","dm.tags[1].value",(char (*) [4])"Tag",
               &dm.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start[1].value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_148);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0xb1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_148);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  Measure<double>::~Measure(&dm);
LAB_00115be5:
  Engine::~Engine(&e);
  return;
}

Assistant:

TEST(Engine, testAddDoubleWithTags) {
    Engine e("test", std::make_unique<TestHandler>());
    e.Add("foo", 10.5, Tag("Hello", "World"), Tag("Another", "Tag"));
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto dm = th->doubleMeasures[0];
    ASSERT_EQ("test.foo", dm.name);
    ASSERT_EQ(MetricType::Counter, dm.type);
    ASSERT_EQ(1, dm.rate);
    ASSERT_EQ(10.5, dm.value);
    ASSERT_EQ(2, dm.tags.size());
    ASSERT_EQ("Hello", dm.tags[0].name);
    ASSERT_EQ("World", dm.tags[0].value);
    ASSERT_EQ("Another", dm.tags[1].name);
    ASSERT_EQ("Tag", dm.tags[1].value);
}